

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9_hashmap_reset(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pObj;
  jx9_hashmap *pMap;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 0x40) == 0)) {
    pObj = pCtx->pRet;
    jx9MemObjRelease(pObj);
    (pObj->x).rVal = 0.0;
    pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  }
  else {
    pMap = (jx9_hashmap *)((*apArg)->x).pOther;
    pMap->pCur = pMap->pFirst;
    HashmapCurrentValue(pCtx,pMap,0);
  }
  return 0;
}

Assistant:

static int jx9_hashmap_reset(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap *pMap;
	if( nArg < 1 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid hashmap */
	if( !jx9_value_is_json_array(apArg[0]) ){
		/* Invalid argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the internal representation of the input hashmap */
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	/* Point to the first node */
	pMap->pCur = pMap->pFirst;
	/* Return the last node value if available */
	HashmapCurrentValue(&(*pCtx), pMap, 0);
	return JX9_OK;
}